

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_execresult(lua_State *L,int stat)

{
  uint uVar1;
  int iVar2;
  char *s;
  
  if (stat == -1) {
    iVar2 = luaL_fileresult(L,0,(char *)0x0);
    return iVar2;
  }
  uVar1 = stat & 0x7f;
  if (uVar1 == 0) {
    stat = (uint)stat >> 8 & 0xff;
    s = "exit";
  }
  else {
    iVar2 = uVar1 * 0x1000000 + 0x1000000;
    if (0x1ffffff < iVar2) {
      stat = uVar1;
    }
    s = "exit";
    if (SBORROW4(iVar2,0x2000000) == (int)(uVar1 * 0x1000000 + -0x1000000) < 0) {
      s = "signal";
    }
  }
  if ((stat == 0) && (*s == 'e')) {
    lua_pushboolean(L,1);
  }
  else {
    lua_pushnil(L);
  }
  lua_pushstring(L,s);
  lua_pushinteger(L,(long)stat);
  return 3;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  const char *what = "exit";  /* type of termination */
  if (stat == -1)  /* error? */
    return luaL_fileresult(L, 0, NULL);
  else {
    l_inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      lua_pushnil(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/nil,what,code */
  }
}